

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O0

int Acec_MatchCountCommon(Vec_Wec_t *vLits1,Vec_Wec_t *vLits2,int Shift)

{
  int iVar1;
  Vec_Int_t *vArr;
  Vec_Int_t *vArr1;
  Vec_Int_t *vArr2;
  int local_40;
  int local_3c;
  int nCommon;
  int i;
  Vec_Int_t *vLevel2;
  Vec_Int_t *vLevel1;
  Vec_Int_t *vRes;
  int Shift_local;
  Vec_Wec_t *vLits2_local;
  Vec_Wec_t *vLits1_local;
  
  vArr = Vec_IntAlloc(100);
  local_40 = 0;
  for (local_3c = 0; iVar1 = Vec_WecSize(vLits1), local_3c < iVar1; local_3c = local_3c + 1) {
    vArr1 = Vec_WecEntry(vLits1,local_3c);
    if ((-1 < local_3c + Shift) && (iVar1 = Vec_WecSize(vLits2), local_3c + Shift < iVar1)) {
      vArr2 = Vec_WecEntry(vLits2,local_3c + Shift);
      iVar1 = Vec_IntTwoFindCommonReverse(vArr1,vArr2,vArr);
      local_40 = iVar1 + local_40;
    }
  }
  Vec_IntFree(vArr);
  return local_40;
}

Assistant:

int Acec_MatchCountCommon( Vec_Wec_t * vLits1, Vec_Wec_t * vLits2, int Shift )
{
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    Vec_Int_t * vLevel1, * vLevel2; 
    int i, nCommon = 0;
    Vec_WecForEachLevel( vLits1, vLevel1, i )
    {
        if ( i+Shift < 0 || i+Shift >= Vec_WecSize(vLits2) )
            continue;
        vLevel2 = Vec_WecEntry( vLits2, i+Shift );
        nCommon += Vec_IntTwoFindCommonReverse( vLevel1, vLevel2, vRes );
    }
    Vec_IntFree( vRes );
    return nCommon;
}